

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O0

void underline(int offset,int left,int right,char *text)

{
  int iVar1;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int i_1;
  int i;
  int column_ref;
  int column;
  char *text_local;
  int right_local;
  int left_local;
  int offset_local;
  
  right_local = offset;
  while (right_local = right_local + -1, 0 < right_local) {
    fputc(0x2d,_stderr);
  }
  i = offset;
  for (local_2c = 0; iVar1 = i, local_2c < left; local_2c = local_2c + 1) {
    if (text[local_2c] == '\t') {
      local_34 = 8 - i % 8;
    }
    else {
      local_34 = 1;
    }
    i = local_34 + i;
  }
  fputnc(' ',(i - offset) + 1,(FILE *)_stderr);
  for (local_30 = left; local_30 <= right; local_30 = local_30 + 1) {
    if (text[local_30] == '\t') {
      local_38 = 8 - i % 8;
    }
    else {
      local_38 = 1;
    }
    i = local_38 + i;
  }
  fputnc('^',i - iVar1,(FILE *)_stderr);
  return;
}

Assistant:

static void underline(int offset, int left, int right, const char *text) {
	auto column = offset;
	while (--offset > 0)
		fputc('-', stderr);
	auto column_ref = column;
	for (auto i = 0; i < left; ++i)
		column += (text[i] == '\t') ? 8 - column % 8 : 1;
	fputnc(' ', column - column_ref + 1, stderr);

	column_ref = column;
	for (auto i = left; i <= right;  ++i)
		column += text[i] == '\t' ? 8 - column % 8 : 1;
	fputnc('^', column - column_ref, stderr);

	// fprintf(stderr, " %d %d %d", offset, left, right);
}